

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qregularexpression.cpp
# Opt level: O0

QString * __thiscall QRegularExpression::errorString(QRegularExpression *this)

{
  long lVar1;
  QRegularExpressionPrivate *pQVar2;
  QChar *pQVar3;
  qsizetype qVar4;
  QString *in_RDI;
  long in_FS_OFFSET;
  char *in_stack_00000048;
  int errorStringLength;
  QString errorString;
  QString *in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff74;
  QRegularExpressionPrivate *in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffd4;
  char *in_stack_ffffffffffffffd8;
  Data *in_stack_ffffffffffffffe0;
  Data *context;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QExplicitlySharedDataPointer<QRegularExpressionPrivate>::data
            ((QExplicitlySharedDataPointer<QRegularExpressionPrivate> *)0x72dcd2);
  QRegularExpressionPrivate::compilePattern(in_stack_ffffffffffffffa8);
  pQVar2 = QExplicitlySharedDataPointer<QRegularExpressionPrivate>::operator->
                     ((QExplicitlySharedDataPointer<QRegularExpressionPrivate> *)0x72dce4);
  if (pQVar2->errorCode == 0) {
    QCoreApplication::translate
              ((char *)in_stack_ffffffffffffffe0,in_stack_00000048,in_stack_ffffffffffffffd8,
               in_stack_ffffffffffffffd4);
  }
  else {
    context = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    QString::QString((QString *)0x72dd22);
    do {
      QString::size((QString *)&stack0xffffffffffffffe0);
      QString::resize((QString *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                      (qsizetype)in_stack_ffffffffffffff68);
      pQVar2 = QExplicitlySharedDataPointer<QRegularExpressionPrivate>::operator->
                         ((QExplicitlySharedDataPointer<QRegularExpressionPrivate> *)0x72dd56);
      in_stack_ffffffffffffff74 = pQVar2->errorCode;
      pQVar3 = QString::data((QString *)
                             CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
      qVar4 = QString::size((QString *)&stack0xffffffffffffffe0);
      in_stack_ffffffffffffff70 = pcre2_get_error_message_16(in_stack_ffffffffffffff74,pQVar3,qVar4)
      ;
    } while (in_stack_ffffffffffffff70 < 0);
    QString::resize((QString *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                    (qsizetype)in_stack_ffffffffffffff68);
    QString::toLatin1(in_stack_ffffffffffffff68);
    QByteArray::constData((QByteArray *)0x72ddca);
    QCoreApplication::translate
              ((char *)context,in_stack_00000048,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4
              );
    QByteArray::~QByteArray((QByteArray *)0x72ddf4);
    QString::~QString((QString *)0x72ddfe);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QString QRegularExpression::errorString() const
{
    d.data()->compilePattern();
    if (d->errorCode) {
        QString errorString;
        int errorStringLength;
        do {
            errorString.resize(errorString.size() + 64);
            errorStringLength = pcre2_get_error_message_16(d->errorCode,
                                                           reinterpret_cast<ushort *>(errorString.data()),
                                                           errorString.size());
        } while (errorStringLength < 0);
        errorString.resize(errorStringLength);

#ifdef QT_NO_TRANSLATION
        return errorString;
#else
        return QCoreApplication::translate("QRegularExpression", std::move(errorString).toLatin1().constData());
#endif
    }
#ifdef QT_NO_TRANSLATION
        return u"no error"_s;
#else
    return QCoreApplication::translate("QRegularExpression", "no error");
#endif
}